

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<char>::addAll<char*,true>(ArrayBuilder<char> *this,char *start,char *end)

{
  char *pcVar1;
  
  pcVar1 = this->pos;
  for (; start != end; start = start + 1) {
    *pcVar1 = *start;
    pcVar1 = pcVar1 + 1;
  }
  this->pos = pcVar1;
  return;
}

Assistant:

void ArrayBuilder<T>::addAll(Iterator start, Iterator end) {
  pos = _::CopyConstructArray_<RemoveConst<T>, Decay<Iterator>, move>::apply(pos, start, end);
}